

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

piece_index_t __thiscall
libtorrent::aux::torrent::get_piece_to_super_seed
          (torrent *this,
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          *bits)

{
  pointer pppVar1;
  peer_connection *this_00;
  bool bVar2;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> iVar3;
  ulong uVar4;
  pointer pppVar5;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> index;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> i;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  avail_vec;
  torrent *__range3;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_38;
  
  avail_vec.
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avail_vec.
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avail_vec.
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = file_storage::piece_range
                    (&((this->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_files);
  iVar9 = 9999;
  iVar6 = iVar3;
  do {
    local_38 = iVar3._end.m_val;
    index = iVar6._begin.m_val;
    if (index.m_val == local_38.m_val) {
      if (avail_vec.
          super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          avail_vec.
          super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar9 = -1;
      }
      else {
        uVar4 = random((aux *)(ulong)((int)((ulong)((long)avail_vec.
                                                                                                                    
                                                  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)avail_vec.
                                                                                                                
                                                  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) -
                                     1));
        iVar9 = avail_vec.
                super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar4 & 0xffffffff].m_val;
      }
      ::std::
      _Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
      ::~_Vector_base(&avail_vec.
                       super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                     );
      return (piece_index_t)iVar9;
    }
    i.m_val = index.m_val;
    bVar2 = bitfield::get_bit(&bits->super_bitfield,index.m_val);
    if (!bVar2) {
      pppVar1 = (this->super_torrent_hot_members).m_connections.
                super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                .
                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      iVar8 = 0;
      for (pppVar5 = (this->super_torrent_hot_members).m_connections.
                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     .
                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; iVar7 = iVar8, pppVar5 != pppVar1;
          pppVar5 = pppVar5 + 1) {
        this_00 = *pppVar5;
        iVar7 = 999;
        if (((this_00->m_superseed_piece)._M_elems[0].m_val == i.m_val) ||
           ((this_00->m_superseed_piece)._M_elems[1].m_val == i.m_val)) break;
        bVar2 = peer_connection::has_piece(this_00,(piece_index_t)i.m_val);
        iVar8 = iVar8 + (uint)bVar2;
      }
      if (iVar7 <= iVar9) {
        if (iVar7 == iVar9) {
          ::std::
          vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ::push_back(&avail_vec,&i);
        }
        else {
          if (avail_vec.
              super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              avail_vec.
              super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            avail_vec.
            super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 avail_vec.
                 super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          ::std::
          vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ::push_back(&avail_vec,&i);
          iVar9 = iVar7;
        }
      }
    }
    iVar6._begin.m_val = index.m_val + 1;
    iVar6._end.m_val = 0;
  } while( true );
}

Assistant:

piece_index_t torrent::get_piece_to_super_seed(typed_bitfield<piece_index_t> const& bits)
	{
		// return a piece with low availability that is not in
		// the bitfield and that is not currently being super
		// seeded by any peer
		TORRENT_ASSERT(m_super_seeding);

		// do a linear search from the first piece
		int min_availability = 9999;
		std::vector<piece_index_t> avail_vec;
		for (auto const i : m_torrent_file->piece_range())
		{
			if (bits[i]) continue;

			int availability = 0;
			for (auto* pc : *this)
			{
				if (pc->super_seeded_piece(i))
				{
					// avoid super-seeding the same piece to more than one
					// peer if we can avoid it. Do this by artificially
					// increase the availability
					availability = 999;
					break;
				}
				if (pc->has_piece(i)) ++availability;
			}
			if (availability > min_availability) continue;
			if (availability == min_availability)
			{
				avail_vec.push_back(i);
				continue;
			}
			TORRENT_ASSERT(availability < min_availability);
			min_availability = availability;
			avail_vec.clear();
			avail_vec.push_back(i);
		}

		if (avail_vec.empty()) return piece_index_t{-1};
		return avail_vec[random(std::uint32_t(avail_vec.size() - 1))];
	}